

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++:213:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_test_c__:213:3)>
            *this)

{
  char (*__name) [35];
  int iVar1;
  Fault local_10;
  
  if (this->canceled == false) {
    __name = (this->func).filename;
    do {
      iVar1 = unlink(*__name);
      if (-1 < iVar1) {
        return;
      }
      iVar1 = Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      Debug::Fault::Fault(&local_10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                          ,0xd5,iVar1,"unlink(filename)","");
      Debug::Fault::fatal(&local_10);
    }
  }
  return;
}

Assistant:

inline ~Deferred() noexcept(false) { if (!canceled) func(); }